

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_headers_init
               (nghttp2_headers *frame,uint8_t flags,int32_t stream_id,nghttp2_headers_category cat,
               nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen)

{
  int32_t iVar1;
  undefined3 uVar2;
  nghttp2_nv *nva_local;
  nghttp2_priority_spec *pri_spec_local;
  nghttp2_headers_category cat_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_headers *frame_local;
  
  nghttp2_frame_hd_init(&frame->hd,0,'\x01',flags,stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->cat = cat;
  if (pri_spec == (nghttp2_priority_spec *)0x0) {
    nghttp2_priority_spec_default_init(&frame->pri_spec);
  }
  else {
    iVar1 = pri_spec->weight;
    (frame->pri_spec).stream_id = pri_spec->stream_id;
    (frame->pri_spec).weight = iVar1;
    uVar2 = *(undefined3 *)&pri_spec->field_0x9;
    (frame->pri_spec).exclusive = pri_spec->exclusive;
    *(undefined3 *)&(frame->pri_spec).field_0x9 = uVar2;
  }
  return;
}

Assistant:

void nghttp2_frame_headers_init(nghttp2_headers *frame, uint8_t flags,
                                int32_t stream_id, nghttp2_headers_category cat,
                                const nghttp2_priority_spec *pri_spec,
                                nghttp2_nv *nva, size_t nvlen) {
  nghttp2_frame_hd_init(&frame->hd, 0, NGHTTP2_HEADERS, flags, stream_id);
  frame->padlen = 0;
  frame->nva = nva;
  frame->nvlen = nvlen;
  frame->cat = cat;

  if (pri_spec) {
    frame->pri_spec = *pri_spec;
  } else {
    nghttp2_priority_spec_default_init(&frame->pri_spec);
  }
}